

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

IVec4 __thiscall
tcu::ConstPixelBufferAccess::getPixelInt(ConstPixelBufferAccess *this,int x,int y,int z)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  Channel CVar4;
  ushort uVar5;
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  int iVar8;
  int iVar9;
  TextureSwizzle *pTVar10;
  ChannelOrder CVar11;
  ChannelOrder CVar12;
  undefined8 extraout_RDX;
  undefined8 uVar13;
  undefined8 extraout_RDX_00;
  undefined4 in_register_00000034;
  ChannelOrder *pCVar14;
  int in_R8D;
  int c;
  long lVar15;
  uint *puVar16;
  TextureFormat TVar17;
  undefined1 auVar18 [16];
  Vector<int,_4> VVar19;
  IVec4 IVar20;
  Vector<unsigned_int,_4> local_68;
  Vector<unsigned_int,_4> local_50;
  IVec4 result;
  
  pCVar14 = (ChannelOrder *)CONCAT44(in_register_00000034,x);
  puVar16 = (uint *)((long)(int)(in_R8D * pCVar14[7]) + (long)(int)(z * pCVar14[6]) +
                    (long)(int)(y * pCVar14[5]) + *(undefined8 *)(pCVar14 + 8));
  Vector<int,_4>::Vector(&result);
  CVar12 = pCVar14[1];
  switch(CVar12) {
  case L:
    CVar11 = *pCVar14;
    uVar13 = extraout_RDX;
    switch(CVar11) {
    case RGB:
    case sRGB:
      bVar1 = *(byte *)((long)puVar16 + 2);
      TVar17.order = (uint)((ushort)*puVar16 & 0xff);
      TVar17.type._0_1_ = (char)((ushort)*puVar16 >> 8);
      TVar17.type._1_3_ = 0;
      this->m_format = TVar17;
      (this->m_size).m_data[0] = (uint)bVar1;
      (this->m_size).m_data[1] = 1;
      goto LAB_001ee949;
    case RGBA:
    case sRGBA:
      uVar3 = *puVar16;
      auVar6[0xc] = (char)(uVar3 >> 0x18);
      auVar6._0_12_ = ZEXT712(0);
      auVar7[1] = 0;
      auVar7[0] = (byte)(uVar3 >> 0x10);
      auVar7._2_3_ = auVar6._10_3_;
      auVar7._5_8_ = 0;
      auVar18[5] = 0;
      auVar18[4] = (byte)(uVar3 >> 8);
      auVar18._6_7_ = SUB137(auVar7 << 0x40,6);
      auVar18._0_4_ = uVar3 & 0xff;
      auVar18._13_3_ = 0;
      break;
    default:
      goto switchD_001ee974_caseD_9;
    }
    break;
  default:
    CVar11 = *pCVar14;
switchD_001ee974_caseD_9:
    pTVar10 = getChannelReadSwizzle(CVar11);
    iVar8 = getChannelSize(CVar12);
    for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
      CVar4 = pTVar10->components[lVar15];
      iVar9 = 0;
      if (CVar4 < CHANNEL_ZERO) {
        iVar9 = anon_unknown_74::channelToInt
                          ((byte *)((long)(int)(CVar4 * iVar8) + (long)puVar16),pCVar14[1]);
LAB_001ee9db:
        result.m_data[lVar15] = iVar9;
      }
      else {
        if (CVar4 == CHANNEL_ZERO) goto LAB_001ee9db;
        if (CVar4 == CHANNEL_ONE) {
          iVar9 = 1;
          goto LAB_001ee9db;
        }
      }
    }
    Vector<int,_4>::Vector((Vector<int,_4> *)this,&result);
    uVar13 = extraout_RDX_00;
    goto LAB_001ee949;
  case RGB:
  case sBGR:
    local_68.m_data[0] = (uint)(byte)((byte)*puVar16 >> 4);
    local_68.m_data[1] = (byte)*puVar16 & 0xf;
    local_68.m_data[2] = 0;
    goto LAB_001ee8f7;
  case RGBA:
  case sBGRA:
    uVar2 = (ushort)*puVar16;
    local_50.m_data[0] = (uint)(uVar2 >> 0xb);
    local_50.m_data[1] = uVar2 >> 5 & 0x3f;
    goto LAB_001ee916;
  case ARGB:
    uVar2 = (ushort)*puVar16;
    local_50.m_data[0] = uVar2 >> 10 & 0x1f;
    local_50.m_data[1] = uVar2 >> 5 & 0x1f;
LAB_001ee916:
    local_50.m_data[2] = uVar2 & 0x1f;
    local_50.m_data[3] = 1;
    Vector<unsigned_int,_4>::cast<int>(&local_68);
    CVar12 = *pCVar14;
    CVar11 = RGB;
LAB_001ee944:
    VVar19 = swizzleRB<int>((tcu *)this,(Vector<int,_4> *)&local_68,CVar12,CVar11);
    uVar13 = VVar19.m_data._8_8_;
    goto LAB_001ee949;
  case BGR:
  case D:
    uVar2 = (ushort)*puVar16;
    uVar5 = uVar2 >> 0xc;
    local_50.m_data[1] = uVar2 >> 8 & 0xf;
    local_50.m_data[2] = uVar2 >> 4 & 0xf;
    local_50.m_data[3] = uVar2 & 0xf;
    goto LAB_001ee863;
  case BGRA:
  case S:
    uVar2 = (ushort)*puVar16;
    uVar5 = uVar2 >> 0xb;
    local_50.m_data[1] = uVar2 >> 6 & 0x1f;
    local_50.m_data[2] = uVar2 >> 1 & 0x1f;
    local_50.m_data[3] = uVar2 & 1;
LAB_001ee863:
    local_50.m_data[0] = (uint)uVar5;
    Vector<unsigned_int,_4>::cast<int>(&local_68);
    CVar12 = *pCVar14;
    CVar11 = RGBA;
    goto LAB_001ee944;
  case sR:
    uVar2 = (ushort)*puVar16;
    local_50.m_data[0] = (uint)(uVar2 >> 0xf);
    local_50.m_data[1] = uVar2 >> 10 & 0x1f;
    local_50.m_data[2] = uVar2 >> 5 & 0x1f;
    local_50.m_data[3] = uVar2 & 0x1f;
    VVar19 = Vector<unsigned_int,_4>::cast<int>(&local_68);
    uVar13 = VVar19.m_data._8_8_;
    auVar18._4_4_ = local_68.m_data[2];
    auVar18._0_4_ = local_68.m_data[1];
    auVar18._8_4_ = local_68.m_data[1];
    auVar18._12_4_ = local_68.m_data[0];
    break;
  case sRG:
    uVar3 = *puVar16;
    local_68.m_data[0] = uVar3 >> 0x16;
    local_68.m_data[1] = uVar3 >> 0xc & 0x3ff;
    local_68.m_data[2] = uVar3 >> 2 & 0x3ff;
LAB_001ee8f7:
    local_68.m_data[3] = 1;
LAB_001ee8fa:
    VVar19 = Vector<unsigned_int,_4>::cast<int>((Vector<unsigned_int,_4> *)this);
    uVar13 = VVar19.m_data._8_8_;
    goto LAB_001ee949;
  case sRGB:
  case DS:
    uVar3 = *puVar16;
    local_68.m_data[0] = -(uVar3 & 0x200) | uVar3 & 0x3ff;
    local_68.m_data[1] = -(uVar3 >> 10 & 0x200) | uVar3 >> 10 & 0x3ff;
    local_68.m_data[2] = -(uVar3 >> 0x14 & 0x200) | uVar3 >> 0x14 & 0x3ff;
    local_68.m_data[3] = -(uVar3 >> 0x1e & 0xfffffffe) | uVar3 >> 0x1e;
    CVar12 = *pCVar14;
    CVar11 = RGBA;
    goto LAB_001ee944;
  case sRGBA:
  case CHANNELORDER_LAST:
    local_50.m_data[3] = *puVar16;
    local_50.m_data[0] = local_50.m_data[3] & 0x3ff;
    local_50.m_data[1] = local_50.m_data[3] >> 10 & 0x3ff;
    local_50.m_data[2] = local_50.m_data[3] >> 0x14 & 0x3ff;
    local_50.m_data[3] = local_50.m_data[3] >> 0x1e;
    swizzleRB<unsigned_int>((tcu *)&local_68,&local_50,*pCVar14,RGBA);
    goto LAB_001ee8fa;
  }
  (this->m_format).order = (int)auVar18._0_8_;
  (this->m_format).type = (int)((ulong)auVar18._0_8_ >> 0x20);
  (this->m_size).m_data[0] = auVar18._8_4_;
  (this->m_size).m_data[1] = auVar18._12_4_;
LAB_001ee949:
  IVar20.m_data[2] = (int)uVar13;
  IVar20.m_data[3] = (int)((ulong)uVar13 >> 0x20);
  IVar20.m_data._0_8_ = this;
  return (IVec4)IVar20.m_data;
}

Assistant:

IVec4 ConstPixelBufferAccess::getPixelInt (int x, int y, int z) const
{
	DE_ASSERT(de::inBounds(x, 0, m_size.x()));
	DE_ASSERT(de::inBounds(y, 0, m_size.y()));
	DE_ASSERT(de::inBounds(z, 0, m_size.z()));
	DE_ASSERT(!isCombinedDepthStencilType(m_format.type)); // combined types cannot be accessed directly
	DE_ASSERT(m_format.order != TextureFormat::DS); // combined formats cannot be accessed directly

	const deUint8* const	pixelPtr = (const deUint8*)getPixelPtr(x, y, z);
	IVec4					result;

	// Optimized fomats.
	if (m_format.type == TextureFormat::UNORM_INT8)
	{
		if (m_format.order == TextureFormat::RGBA || m_format.order == TextureFormat::sRGBA)
			return readRGBA8888Int(pixelPtr);
		else if (m_format.order == TextureFormat::RGB || m_format.order == TextureFormat::sRGB)
			return readRGB888Int(pixelPtr);
	}

#define U8(OFFS, COUNT)			((*((const deUint8* )pixelPtr) >> (OFFS)) & ((1<<(COUNT))-1))
#define U16(OFFS, COUNT)		((*((const deUint16*)pixelPtr) >> (OFFS)) & ((1<<(COUNT))-1))
#define U32(OFFS, COUNT)		((*((const deUint32*)pixelPtr) >> (OFFS)) & ((1<<(COUNT))-1))
#define S32(OFFS, COUNT)		signExtend(U32(OFFS, COUNT), (COUNT))

	switch (m_format.type)
	{
		case TextureFormat::UNSIGNED_BYTE_44:			// Fall-through
		case TextureFormat::UNORM_BYTE_44:				return			 UVec4(U8 ( 4,  4), U8 ( 0,  4), 0u, 1u).cast<int>();
		case TextureFormat::UNSIGNED_SHORT_565:			// Fall-through
		case TextureFormat::UNORM_SHORT_565:			return swizzleRB(UVec4(U16(11,  5), U16( 5,  6), U16( 0,  5), 1).cast<int>(), m_format.order, TextureFormat::RGB);
		case TextureFormat::UNORM_SHORT_555:			return swizzleRB(UVec4(U16(10,  5), U16( 5,  5), U16( 0,  5), 1).cast<int>(), m_format.order, TextureFormat::RGB);
		case TextureFormat::UNSIGNED_SHORT_4444:		// Fall-through
		case TextureFormat::UNORM_SHORT_4444:			return swizzleRB(UVec4(U16(12,  4), U16( 8,  4), U16( 4,  4), U16( 0, 4)).cast<int>(), m_format.order, TextureFormat::RGBA);
		case TextureFormat::UNSIGNED_SHORT_5551:		// Fall-through
		case TextureFormat::UNORM_SHORT_5551:			return swizzleRB(UVec4(U16(11,  5), U16( 6,  5), U16( 1,  5), U16( 0, 1)).cast<int>(), m_format.order, TextureFormat::RGBA);
		case TextureFormat::UNORM_INT_101010:			return			 UVec4(U32(22, 10), U32(12, 10), U32( 2, 10), 1).cast<int>();
		case TextureFormat::UNORM_INT_1010102_REV:		// Fall-through
		case TextureFormat::UNSIGNED_INT_1010102_REV:	return swizzleRB(UVec4(U32( 0, 10), U32(10, 10), U32(20, 10), U32(30, 2)), m_format.order, TextureFormat::RGBA).cast<int>();
		case TextureFormat::SNORM_INT_1010102_REV:		// Fall-through
		case TextureFormat::SIGNED_INT_1010102_REV:		return swizzleRB(IVec4(S32( 0, 10), S32(10, 10), S32(20, 10), S32(30, 2)), m_format.order, TextureFormat::RGBA);

		case TextureFormat::UNORM_SHORT_1555:
			DE_ASSERT(m_format.order == TextureFormat::ARGB);
			return UVec4(U16(15, 1), U16(10, 5), U16(5, 5), U16(0, 5)).cast<int>().swizzle(1,2,3,0); // ARGB -> RGBA

		default:
			break; // To generic path.
	}

#undef U8
#undef U16
#undef U32
#undef S32

	// Generic path.
	const TextureSwizzle::Channel*	channelMap	= getChannelReadSwizzle(m_format.order).components;
	int								channelSize	= getChannelSize(m_format.type);

	for (int c = 0; c < 4; c++)
	{
		switch (channelMap[c])
		{
			case TextureSwizzle::CHANNEL_0:
			case TextureSwizzle::CHANNEL_1:
			case TextureSwizzle::CHANNEL_2:
			case TextureSwizzle::CHANNEL_3:
				result[c] = channelToInt(pixelPtr + channelSize*((int)channelMap[c]), m_format.type);
				break;

			case TextureSwizzle::CHANNEL_ZERO:
				result[c] = 0;
				break;

			case TextureSwizzle::CHANNEL_ONE:
				result[c] = 1;
				break;

			default:
				DE_ASSERT(false);
		}
	}

	return result;
}